

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int luv_udp_send(lua_State *L)

{
  int iVar1;
  uv_udp_t *handle_00;
  ulong uVar2;
  luv_req_t *plVar3;
  undefined1 local_d0 [8];
  sockaddr_storage addr;
  char *host;
  int ref;
  int port;
  int ret;
  uv_buf_t buf;
  uv_udp_send_t *req;
  uv_udp_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_udp(L,1);
  luv_check_buf(L,2,(uv_buf_t *)&port);
  addr.__ss_align = (unsigned_long)luaL_checklstring(L,3,(size_t *)0x0);
  uVar2 = luaL_checkinteger(L,4);
  iVar1 = uv_ip4_addr((char *)addr.__ss_align,(int)uVar2,(sockaddr_in *)local_d0);
  if ((iVar1 != 0) &&
     (iVar1 = uv_ip6_addr((char *)addr.__ss_align,(int)uVar2,(sockaddr_in6 *)local_d0), iVar1 != 0))
  {
    iVar1 = luaL_error(L,"Invalid IP address or port [%s:%d]",addr.__ss_align,uVar2 & 0xffffffff);
    return iVar1;
  }
  iVar1 = luv_check_continuation(L,5);
  buf.len = (size_t)lua_newuserdata(L,0x140);
  plVar3 = luv_setup_req(L,iVar1);
  *(luv_req_t **)buf.len = plVar3;
  iVar1 = uv_udp_send((uv_udp_send_t *)buf.len,handle_00,(uv_buf_t *)&port,1,(sockaddr *)local_d0,
                      luv_udp_send_cb);
  if (iVar1 < 0) {
    luv_cleanup_req(L,*(luv_req_t **)buf.len);
    lua_settop(L,-2);
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_udp_send(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  uv_udp_send_t* req;
  int ret, ref;
  struct sockaddr_storage addr;
  struct sockaddr* addr_ptr;
  luv_handle_t* lhandle = handle->data;
  addr_ptr = luv_check_addr(L, &addr, 3, 4);
  ref = luv_check_continuation(L, 5);
  req = (uv_udp_send_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, lhandle->ctx, ref);
  size_t count;
  uv_buf_t* bufs = luv_check_bufs(L, 2, &count, (luv_req_t*)req->data);
  ret = uv_udp_send(req, handle, bufs, count, addr_ptr, luv_udp_send_cb);
  free(bufs);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  lua_pushinteger(L, ret);
  return 1;
}